

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
::find<google::protobuf::FieldDescriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
           *this,key_arg<const_google::protobuf::FieldDescriptor_*> *key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t v;
  iterator iVar3;
  
  AssertHashEqConsistent<google::protobuf::FieldDescriptor_const*>(this,key);
  if (*(long *)this == 1) {
    iVar3 = find_soo<google::protobuf::FieldDescriptor_const*>(this,key);
    return iVar3;
  }
  if (*(long *)this != 0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::prefetch_heap_block
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)this);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*key;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = &(*key)->super_SymbolBase +
                   (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8));
    iVar3 = find_non_soo<google::protobuf::FieldDescriptor_const*>
                      (this,key,SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
                                SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0));
    return iVar3;
  }
  __assert_fail("!kEnabled || cap >= kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb37,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<const google::protobuf::FieldDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
               );
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }